

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

ll_elem * ll_unlink_robust(ll_head *q_head,ll_elem *n)

{
  int iVar1;
  int inslock;
  
  do {
    iVar1 = insert_lock(n);
    if (iVar1 != 0) {
      return (ll_elem *)0x0;
    }
    iVar1 = unlink((char *)q_head);
  } while (iVar1 == 0);
  unlink_release((ll_head *)n,(ll_elem *)0x1,inslock);
  return n;
}

Assistant:

struct ll_elem*
ll_unlink_robust(struct ll_head *q_head, struct ll_elem *n)
{
	for (;;) {
		if (insert_lock(n))
			return NULL;

		if (unlink(q_head, n)) {
			unlink_release(q_head, n, 1);
			return n;
		}
		SPINWAIT();
	}
}